

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O1

void __thiscall ByteCodeGenerator::InitScopeSlotArray(ByteCodeGenerator *this,FuncInfo *funcInfo)

{
  uint uVar1;
  uint uVar2;
  Symbol *pSVar3;
  code *pcVar4;
  undefined8 uVar5;
  bool bVar6;
  BOOL BVar7;
  PropertyId PVar8;
  undefined4 *puVar9;
  FunctionBody *this_00;
  Recycler *this_01;
  char *ptr;
  Symbol *this_02;
  ulong uVar10;
  Type TVar11;
  undefined1 local_70 [8];
  TrackAllocData data;
  
  uVar1 = funcInfo->bodyScope->scopeSlotCount;
  if (((funcInfo->paramScope != (Scope *)0x0) && (funcInfo->paramScope->scopeSlotCount != 0)) &&
     ((*(uint *)&funcInfo->field_0xb4 & 0x8000) != 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x717,
                       "(funcInfo->paramScope == nullptr || funcInfo->paramScope->GetScopeSlotCount() == 0 || isSplitScope)"
                       ,
                       "funcInfo->paramScope == nullptr || funcInfo->paramScope->GetScopeSlotCount() == 0 || isSplitScope"
                      );
    if (!bVar6) goto LAB_0080edff;
    *puVar9 = 0;
  }
  if (funcInfo->paramScope == (Scope *)0x0) {
    TVar11 = 0;
  }
  else {
    TVar11 = funcInfo->paramScope->scopeSlotCount;
  }
  if (TVar11 != 0 || uVar1 != 0) {
    this_00 = FuncInfo::GetParsedFunctionBody(funcInfo);
    (this_00->super_ParseableFunctionInfo).scopeSlotArraySize = uVar1;
    (this_00->super_ParseableFunctionInfo).paramScopeSlotArraySize = TVar11;
    if (uVar1 == 0) {
      return;
    }
    local_70 = (undefined1  [8])&int::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_35f8e87;
    data.filename._0_4_ = 0x728;
    data.plusSize = (ulong)uVar1;
    this_01 = Memory::Recycler::TrackAllocInfo
                        (this->scriptContext->recycler,(TrackAllocData *)local_70);
    BVar7 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar7 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                         "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar6) goto LAB_0080edff;
      *puVar9 = 0;
    }
    ptr = Memory::Recycler::AllocZeroWithAttributes<(Memory::ObjectInfoBits)32,false>
                    (this_01,(ulong)uVar1 * 4);
    if (ptr == (char *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar6) goto LAB_0080edff;
      *puVar9 = 0;
    }
    (this_00->super_ParseableFunctionInfo).scopeSlotArraySize = uVar1;
    (this_00->super_ParseableFunctionInfo).paramScopeSlotArraySize = TVar11;
    Js::FunctionProxy::SetAuxPtr((FunctionProxy *)this_00,PropertyIdsForScopeSlotArray,ptr);
    if ((((this_00->super_ParseableFunctionInfo).super_FunctionProxy.field_0x47 & 0x50) == 0x10) &&
       ((this_00->super_ParseableFunctionInfo).scopeSlotArraySize != uVar1)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x72b,
                         "(!byteCodeFunction->IsReparsed() || byteCodeFunction->WasEverAsmJsMode() || byteCodeFunction->scopeSlotArraySize == scopeSlotCount)"
                         ,"The slot array size is different between debug and non-debug mode");
      if (!bVar6) {
LAB_0080edff:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar9 = 0;
    }
    memset(ptr,0xff,(ulong)(uVar1 + (uVar1 == 0)) << 2);
    this_02 = funcInfo->bodyScope->m_symList;
    if (this_02 != (Symbol *)0x0) {
      data._32_8_ = __tls_get_addr(&PTR_0155fe48);
      do {
        pSVar3 = this_02->next;
        bVar6 = Symbol::NeedsSlotAlloc(this_02,this,funcInfo);
        if (bVar6) {
          if (this_02->scopeSlot == -1) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            uVar5 = data._32_8_;
            *(undefined4 *)data._32_8_ = 1;
            bVar6 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                               ,0x742,"(sym->HasScopeSlot())","sym->HasScopeSlot()");
            if (!bVar6) goto LAB_0080edff;
            *(undefined4 *)uVar5 = 0;
          }
          uVar2 = this_02->scopeSlot;
          PVar8 = Symbol::EnsurePosition(this_02,funcInfo);
          if (((long)(int)uVar2 < 0) || (uVar1 <= uVar2)) {
            Js::Throw::FatalInternalError(-0x7fffbffb);
          }
          *(PropertyId *)(ptr + (long)(int)uVar2 * 4) = PVar8;
        }
        this_02 = pSVar3;
      } while (pSVar3 != (Symbol *)0x0);
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    uVar10 = 0;
    do {
      if ((*(int *)(ptr + uVar10 * 4) == -1) && (funcInfo->frameObjRegister == 0xffffffff)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar9 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x74d,
                           "(propertyIdsForScopeSlotArray[i] != Js::Constants::NoProperty || funcInfo->frameObjRegister != Js::Constants::NoRegister)"
                           ,
                           "propertyIdsForScopeSlotArray[i] != Js::Constants::NoProperty || funcInfo->frameObjRegister != Js::Constants::NoRegister"
                          );
        if (!bVar6) goto LAB_0080edff;
        *puVar9 = 0;
      }
      uVar10 = uVar10 + 1;
    } while (uVar1 + (uVar1 == 0) != uVar10);
  }
  return;
}

Assistant:

void ByteCodeGenerator::InitScopeSlotArray(FuncInfo * funcInfo)
{
    // Record slots info for ScopeSlots/ScopeObject.
    uint scopeSlotCount = funcInfo->bodyScope->GetScopeSlotCount();
    bool isSplitScope = !funcInfo->IsBodyAndParamScopeMerged();
    Assert(funcInfo->paramScope == nullptr || funcInfo->paramScope->GetScopeSlotCount() == 0 || isSplitScope);
    uint scopeSlotCountForParamScope = funcInfo->paramScope != nullptr ? funcInfo->paramScope->GetScopeSlotCount() : 0;

    if (scopeSlotCount == 0 && scopeSlotCountForParamScope == 0)
    {
        return;
    }

    Js::FunctionBody *byteCodeFunction = funcInfo->GetParsedFunctionBody();
    if (scopeSlotCount > 0 || scopeSlotCountForParamScope > 0)
    {
        byteCodeFunction->SetScopeSlotArraySizes(scopeSlotCount, scopeSlotCountForParamScope);
    }

    // TODO: Need to add property ids for the case when scopeSlotCountForParamSCope is non-zero
    if (scopeSlotCount)
    {
        Js::PropertyId *propertyIdsForScopeSlotArray = RecyclerNewArrayLeafZ(scriptContext->GetRecycler(), Js::PropertyId, scopeSlotCount);
        byteCodeFunction->SetPropertyIdsForScopeSlotArray(propertyIdsForScopeSlotArray, scopeSlotCount, scopeSlotCountForParamScope);
        AssertMsg(!byteCodeFunction->IsReparsed() || byteCodeFunction->WasEverAsmJsMode() || byteCodeFunction->scopeSlotArraySize == scopeSlotCount,
            "The slot array size is different between debug and non-debug mode");
#if DEBUG
        for (UINT i = 0; i < scopeSlotCount; i++)
        {
            propertyIdsForScopeSlotArray[i] = Js::Constants::NoProperty;
        }
#endif
        auto setPropertyIdForScopeSlotArray =
            [scopeSlotCount, propertyIdsForScopeSlotArray]
            (Js::PropertyId slot, Js::PropertyId propId)
        {
            if (slot < 0 || (uint)slot >= scopeSlotCount)
            {
                Js::Throw::FatalInternalError();
            }
            propertyIdsForScopeSlotArray[slot] = propId;
        };

        auto setPropIdsForScopeSlotArray = [this, funcInfo, setPropertyIdForScopeSlotArray](Symbol *const sym)
        {
            if (sym->NeedsSlotAlloc(this, funcInfo))
            {
                // All properties should get correct propertyId here.
                Assert(sym->HasScopeSlot()); // We can't allocate scope slot now. Any symbol needing scope slot must have allocated it before this point.
                setPropertyIdForScopeSlotArray(sym->GetScopeSlot(), sym->EnsurePosition(funcInfo));
            }
        };

        funcInfo->GetBodyScope()->ForEachSymbol(setPropIdsForScopeSlotArray);

#if DEBUG
        for (UINT i = 0; i < scopeSlotCount; i++)
        {
            Assert(propertyIdsForScopeSlotArray[i] != Js::Constants::NoProperty
                || funcInfo->frameObjRegister != Js::Constants::NoRegister); // ScopeObject may have unassigned entries, e.g. for same-named parameters
        }
#endif
    }
}